

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

char * loguru::home_dir(void)

{
  char *pcVar1;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  home_dir();
}

Assistant:

const char* home_dir()
	{
		#ifdef _WIN32
			auto user_profile = getenv("USERPROFILE");
			CHECK_F(user_profile != nullptr, "Missing USERPROFILE");
			return user_profile;
		#else // _WIN32
			auto home = getenv("HOME");
			CHECK_F(home != nullptr, "Missing HOME");
			return home;
		#endif // _WIN32
	}